

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

void __thiscall tinyusdz::value::frame4d::frame4d(frame4d *this)

{
  frame4d *this_local;
  
  this->m[0][0] = 1.0;
  this->m[0][1] = 0.0;
  this->m[0][2] = 0.0;
  this->m[0][3] = 0.0;
  this->m[1][0] = 0.0;
  this->m[1][1] = 1.0;
  this->m[1][2] = 0.0;
  this->m[1][3] = 0.0;
  this->m[2][0] = 0.0;
  this->m[2][1] = 0.0;
  this->m[2][2] = 1.0;
  this->m[2][3] = 0.0;
  this->m[3][0] = 0.0;
  this->m[3][1] = 0.0;
  this->m[3][2] = 0.0;
  this->m[3][3] = 1.0;
  return;
}

Assistant:

frame4d() {
    m[0][0] = 1.0;
    m[0][1] = 0.0;
    m[0][2] = 0.0;
    m[0][3] = 0.0;

    m[1][0] = 0.0;
    m[1][1] = 1.0;
    m[1][2] = 0.0;
    m[1][3] = 0.0;

    m[2][0] = 0.0;
    m[2][1] = 0.0;
    m[2][2] = 1.0;
    m[2][3] = 0.0;

    m[3][0] = 0.0;
    m[3][1] = 0.0;
    m[3][2] = 0.0;
    m[3][3] = 1.0;
  }